

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::add
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,CScaledGlyph *item)

{
  vec4 *pvVar1;
  int iVar2;
  CScaledGlyph *pCVar3;
  CGlyph *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  CScaledGlyph *pCVar7;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar8;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar9;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aVar10;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar11;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar12;
  int iVar13;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar14;
  float fVar15;
  int iVar16;
  
  incsize(this);
  iVar2 = this->num_elements;
  if (this->list_size <= iVar2) {
    alloc(this,iVar2 + 1);
  }
  this->num_elements = iVar2 + 1;
  pCVar3 = this->list;
  pCVar4 = item->m_pGlyph;
  fVar15 = item->m_Size;
  iVar16 = item->m_NumChars;
  iVar13 = item->m_Line;
  aVar14 = (item->m_Advance).field_0;
  uVar5 = *(undefined8 *)&(item->m_Advance).field_1;
  aVar11 = (item->m_TextColor).field_1;
  aVar12 = (item->m_TextColor).field_2;
  uVar6 = *(undefined8 *)&(item->m_TextColor).field_3;
  aVar8 = (item->m_SecondaryColor).field_1;
  aVar9 = (item->m_SecondaryColor).field_2;
  aVar10 = (item->m_SecondaryColor).field_3;
  pvVar1 = &pCVar3[iVar2].m_SecondaryColor;
  pvVar1->field_0 = (item->m_SecondaryColor).field_0;
  pvVar1->field_1 = aVar8;
  pvVar1->field_2 = aVar9;
  pvVar1->field_3 = aVar10;
  pCVar7 = pCVar3 + iVar2;
  (pCVar7->m_TextColor).field_1 = aVar11;
  (pCVar7->m_TextColor).field_2 = aVar12;
  *(undefined8 *)(&(pCVar7->m_TextColor).field_1 + 2) = uVar6;
  pCVar7 = pCVar3 + iVar2;
  pCVar7->m_Line = iVar13;
  (pCVar7->m_Advance).field_0 = aVar14;
  *(undefined8 *)(&pCVar7->m_Line + 2) = uVar5;
  pCVar3 = pCVar3 + iVar2;
  pCVar3->m_pGlyph = pCVar4;
  pCVar3->m_Size = fVar15;
  pCVar3->m_NumChars = iVar16;
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}